

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O3

Dist * Omega_h::close_up(Dist *__return_storage_ptr__,Mesh *mesh,RemoteGraph *own_verts2own_elems,
                        Dist *verts2owners)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  LO nrroots;
  Dist *extraout_RAX;
  Read<long> old_owner_globals;
  Remotes elem_uses;
  Dist uses2old_owners;
  Dist own_verts2verts;
  GOs local_2f8;
  Alloc *local_2e8;
  element_type *local_2e0;
  Remotes local_2d8;
  CommPtr local_2b8;
  RemoteGraph local_2a8;
  Remotes local_278;
  Dist local_258;
  Dist local_1c8;
  Dist local_138;
  Dist local_a8;
  
  Dist::invert(&local_a8,verts2owners);
  local_2a8.locals2edges.write_.shared_alloc_.alloc =
       (own_verts2own_elems->locals2edges).write_.shared_alloc_.alloc;
  if (((ulong)local_2a8.locals2edges.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.locals2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8.locals2edges.write_.shared_alloc_.alloc =
           (Alloc *)((local_2a8.locals2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_2a8.locals2edges.write_.shared_alloc_.alloc)->use_count =
           (local_2a8.locals2edges.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2a8.locals2edges.write_.shared_alloc_.direct_ptr =
       (own_verts2own_elems->locals2edges).write_.shared_alloc_.direct_ptr;
  local_2a8.edges2remotes.ranks.write_.shared_alloc_.alloc =
       (own_verts2own_elems->edges2remotes).ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_2a8.edges2remotes.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.edges2remotes.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8.edges2remotes.ranks.write_.shared_alloc_.alloc =
           (Alloc *)((local_2a8.edges2remotes.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_2a8.edges2remotes.ranks.write_.shared_alloc_.alloc)->use_count =
           (local_2a8.edges2remotes.ranks.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2a8.edges2remotes.ranks.write_.shared_alloc_.direct_ptr =
       (own_verts2own_elems->edges2remotes).ranks.write_.shared_alloc_.direct_ptr;
  local_2a8.edges2remotes.idxs.write_.shared_alloc_.alloc =
       (own_verts2own_elems->edges2remotes).idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_2a8.edges2remotes.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.edges2remotes.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8.edges2remotes.idxs.write_.shared_alloc_.alloc =
           (Alloc *)((local_2a8.edges2remotes.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_2a8.edges2remotes.idxs.write_.shared_alloc_.alloc)->use_count =
           (local_2a8.edges2remotes.idxs.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2a8.edges2remotes.idxs.write_.shared_alloc_.direct_ptr =
       (own_verts2own_elems->edges2remotes).idxs.write_.shared_alloc_.direct_ptr;
  Dist::Dist(&local_138,&local_a8);
  push_elem_uses(&local_278,&local_2a8,&local_138);
  Dist::~Dist(&local_138);
  RemoteGraph::~RemoteGraph(&local_2a8);
  Mesh::comm(mesh);
  local_2d8.ranks.write_.shared_alloc_.alloc = local_278.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_278.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_278.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2d8.ranks.write_.shared_alloc_.alloc =
           (Alloc *)((local_278.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_278.ranks.write_.shared_alloc_.alloc)->use_count =
           (local_278.ranks.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2d8.ranks.write_.shared_alloc_.direct_ptr = local_278.ranks.write_.shared_alloc_.direct_ptr;
  local_2d8.idxs.write_.shared_alloc_.alloc = local_278.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_278.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_278.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2d8.idxs.write_.shared_alloc_.alloc =
           (Alloc *)((local_278.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_278.idxs.write_.shared_alloc_.alloc)->use_count =
           (local_278.idxs.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2d8.idxs.write_.shared_alloc_.direct_ptr = local_278.idxs.write_.shared_alloc_.direct_ptr;
  nrroots = Mesh::nelems(mesh);
  Dist::Dist(&local_1c8,&local_2b8,&local_2d8,nrroots);
  pAVar3 = local_2d8.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_2d8.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2d8.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2d8.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2d8.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_2d8.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_2d8.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2d8.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_2d8.ranks.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_2d8.ranks.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (local_2b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((uint)mesh->dim_ < 4) {
    Mesh::globals((Mesh *)&local_2e8,(Int)mesh);
    Dist::Dist(&local_258,&local_1c8);
    local_2f8.write_.shared_alloc_.alloc = local_2e8;
    if (((ulong)local_2e8 & 7) == 0 && local_2e8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2f8.write_.shared_alloc_.alloc = (Alloc *)(local_2e8->size * 8 + 1);
      }
      else {
        local_2e8->use_count = local_2e8->use_count + 1;
      }
    }
    local_2f8.write_.shared_alloc_.direct_ptr = local_2e0;
    get_new_copies2old_owners(__return_storage_ptr__,&local_258,&local_2f8);
    pAVar3 = local_2f8.write_.shared_alloc_.alloc;
    if (((ulong)local_2f8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_2f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_2f8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2f8.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    Dist::~Dist(&local_258);
    if (((ulong)local_2e8 & 7) == 0 && local_2e8 != (Alloc *)0x0) {
      piVar1 = &local_2e8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2e8);
        operator_delete(local_2e8,0x48);
      }
    }
    Dist::~Dist(&local_1c8);
    if (((ulong)local_278.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
        local_278.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_278.idxs.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_278.idxs.write_.shared_alloc_.alloc);
        operator_delete(local_278.idxs.write_.shared_alloc_.alloc,0x48);
      }
    }
    if (((ulong)local_278.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
        local_278.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_278.ranks.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_278.ranks.write_.shared_alloc_.alloc);
        operator_delete(local_278.ranks.write_.shared_alloc_.alloc,0x48);
      }
    }
    Dist::~Dist(&local_a8);
    return extraout_RAX;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

static Dist close_up(
    Mesh* mesh, RemoteGraph own_verts2own_elems, Dist verts2owners) {
  auto own_verts2verts = verts2owners.invert();
  auto elem_uses = push_elem_uses(own_verts2own_elems, own_verts2verts);
  auto uses2old_owners = Dist(mesh->comm(), elem_uses, mesh->nelems());
  auto old_owner_globals = mesh->globals(mesh->dim());
  auto elems2owners =
      get_new_copies2old_owners(uses2old_owners, old_owner_globals);
  return elems2owners;
}